

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::columnMoved(QTableView *this,int column,int oldIndex,int newIndex)

{
  bool bVar1;
  int iVar2;
  QTableViewPrivate *pQVar3;
  int *piVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int width;
  int right;
  int left;
  int logicalNewIndex;
  int logicalOldIndex;
  QTableViewPrivate *d;
  int newRight;
  int oldRight;
  int newLeft;
  int oldLeft;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar5;
  int in_stack_ffffffffffffff94;
  QHeaderView *in_stack_ffffffffffffff98;
  QWidget *pQVar6;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QTableView *)0x8b61a6);
  (**(code **)(*(long *)in_RDI + 0x268))();
  QHeaderView::logicalIndex(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  QHeaderView::logicalIndex(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  bVar1 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b61f5);
  if (bVar1) {
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    local_c = columnViewportPosition
                        ((QTableView *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                         ,in_stack_ffffffffffffff8c);
    local_10 = columnViewportPosition
                         ((QTableView *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff8c);
    iVar5 = local_c;
    local_14 = columnWidth((QTableView *)CONCAT44(in_stack_ffffffffffffff94,local_c),
                           in_stack_ffffffffffffff8c);
    local_14 = iVar5 + local_14;
    iVar2 = local_10;
    local_18 = columnWidth((QTableView *)CONCAT44(local_10,iVar5),in_stack_ffffffffffffff8c);
    local_18 = iVar2 + local_18;
    piVar4 = qMin<int>(&local_c,&local_10);
    iVar5 = *piVar4;
    piVar4 = qMax<int>(&local_14,&local_18);
    iVar2 = *piVar4 - iVar5;
    pQVar6 = (pQVar3->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
    QWidget::height((QWidget *)0x8b62e1);
    QWidget::update(in_RDI,iVar2,iVar5,(int)((ulong)pQVar6 >> 0x20),(int)pQVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::columnMoved(int column, int oldIndex, int newIndex)
{
    Q_UNUSED(column);
    Q_D(QTableView);

    updateGeometries();
    int logicalOldIndex = d->horizontalHeader->logicalIndex(oldIndex);
    int logicalNewIndex = d->horizontalHeader->logicalIndex(newIndex);
    if (d->hasSpans()) {
        d->viewport->update();
    } else {
        int oldLeft = columnViewportPosition(logicalOldIndex);
        int newLeft = columnViewportPosition(logicalNewIndex);
        int oldRight = oldLeft + columnWidth(logicalOldIndex);
        int newRight = newLeft + columnWidth(logicalNewIndex);
        int left = qMin(oldLeft, newLeft);
        int right = qMax(oldRight, newRight);
        int width = right - left;
        d->viewport->update(left, 0, width, d->viewport->height());
    }
}